

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O3

void __thiscall Args::Arg::checkCorrectnessAfterParsing(Arg *this)

{
  long lVar1;
  int iVar2;
  logic_error *this_00;
  long *plVar3;
  ulong *puVar4;
  ulong *local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar2 = (*(this->super_ArgIface)._vptr_ArgIface[5])();
  if ((char)iVar2 != '\0') {
    iVar2 = (*(this->super_ArgIface)._vptr_ArgIface[6])(this);
    if ((char)iVar2 == '\0') {
      this_00 = (logic_error *)__cxa_allocate_exception(0x30);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Undefined required argument \"","");
      (*(this->super_ArgIface)._vptr_ArgIface[3])(&local_68,this);
      std::operator+(&local_48,&local_88,&local_68);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_a8 = (ulong *)*plVar3;
      puVar4 = (ulong *)(plVar3 + 2);
      if (local_a8 == puVar4) {
        local_98 = *puVar4;
        uStack_90 = plVar3[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *puVar4;
      }
      lVar1 = plVar3[1];
      *plVar3 = (long)puVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
      *(undefined ***)this_00 = &PTR__BaseException_0013eca0;
      *(logic_error **)(this_00 + 0x10) = this_00 + 0x20;
      if (local_a8 == &local_98) {
        *(undefined4 *)(this_00 + 0x20) = (undefined4)local_98;
        *(undefined4 *)(this_00 + 0x24) = local_98._4_4_;
        *(undefined4 *)(this_00 + 0x28) = (undefined4)uStack_90;
        *(undefined4 *)(this_00 + 0x2c) = uStack_90._4_4_;
      }
      else {
        *(ulong **)(this_00 + 0x10) = local_a8;
        *(ulong *)(this_00 + 0x20) = local_98;
      }
      *(long *)(this_00 + 0x18) = lVar1;
      local_98 = local_98 & 0xffffffffffffff00;
      __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
    }
  }
  return;
}

Assistant:

inline void
Arg::checkCorrectnessAfterParsing() const
{
	if( isRequired() && !isDefined() )
		throw BaseException( String( SL( "Undefined required argument \"" ) ) +
			name() + SL( "\"." ) );
}